

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int argon2_thread_join(argon2_thread_handle_t handle)

{
  int iVar1;
  argon2_thread_handle_t handle_local;
  
  iVar1 = pthread_join(handle,(void **)0x0);
  return iVar1;
}

Assistant:

int argon2_thread_join(argon2_thread_handle_t handle) {
#if defined(_WIN32)
    if (WaitForSingleObject((HANDLE)handle, INFINITE) == WAIT_OBJECT_0) {
        return CloseHandle((HANDLE)handle) != 0 ? 0 : -1;
    }
    return -1;
#else
    return pthread_join(handle, NULL);
#endif
}